

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void determine_system_keymap(void)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  undefined1 *puVar4;
  long lVar5;
  char *pcVar6;
  long *plVar7;
  allocator local_399;
  string local_398 [36];
  wchar_t local_374;
  int local_370;
  int utf8code;
  int index;
  uint i;
  string line;
  string local_338 [32];
  stringstream local_318 [8];
  stringstream dump;
  long local_190;
  stringstream ss;
  ostream local_180 [376];
  
  char_keys[0x2c] = L'\0';
  char_keys[0x2d] = L'\0';
  char_keys[0x2e] = L'\0';
  char_keys[0x2f] = L'\0';
  char_keys[0x28] = L'\0';
  char_keys[0x29] = L'\0';
  char_keys[0x2a] = L'\0';
  char_keys[0x2b] = L'\0';
  char_keys[0x24] = L'\0';
  char_keys[0x25] = L'\0';
  char_keys[0x26] = L'\0';
  char_keys[0x27] = L'\0';
  char_keys[0x20] = L'\0';
  char_keys[0x21] = L'\0';
  char_keys[0x22] = L'\0';
  char_keys[0x23] = L'\0';
  char_keys[0x1c] = L'\0';
  char_keys[0x1d] = L'\0';
  char_keys[0x1e] = L'\0';
  char_keys[0x1f] = L'\0';
  char_keys[0x18] = L'\0';
  char_keys[0x19] = L'\0';
  char_keys[0x1a] = L'\0';
  char_keys[0x1b] = L'\0';
  char_keys[0x14] = L'\0';
  char_keys[0x15] = L'\0';
  char_keys[0x16] = L'\0';
  char_keys[0x17] = L'\0';
  char_keys[0x10] = L'\0';
  char_keys[0x11] = L'\0';
  char_keys[0x12] = L'\0';
  char_keys[0x13] = L'\0';
  char_keys[0xc] = L'\0';
  char_keys[0xd] = L'\0';
  char_keys[0xe] = L'\0';
  char_keys[0xf] = L'\0';
  char_keys[8] = L'\0';
  char_keys[9] = L'\0';
  char_keys[10] = L'\0';
  char_keys[0xb] = L'\0';
  char_keys[4] = L'\0';
  char_keys[5] = L'\0';
  char_keys[6] = L'\0';
  char_keys[7] = L'\0';
  char_keys[0] = L'\0';
  char_keys[1] = L'\0';
  char_keys[2] = L'\0';
  char_keys[3] = L'\0';
  char_keys[0x30] = L'\0';
  shift_keys[0x2c] = L'\0';
  shift_keys[0x2d] = L'\0';
  shift_keys[0x2e] = L'\0';
  shift_keys[0x2f] = L'\0';
  shift_keys[0x28] = L'\0';
  shift_keys[0x29] = L'\0';
  shift_keys[0x2a] = L'\0';
  shift_keys[0x2b] = L'\0';
  shift_keys[0x24] = L'\0';
  shift_keys[0x25] = L'\0';
  shift_keys[0x26] = L'\0';
  shift_keys[0x27] = L'\0';
  shift_keys[0x20] = L'\0';
  shift_keys[0x21] = L'\0';
  shift_keys[0x22] = L'\0';
  shift_keys[0x23] = L'\0';
  shift_keys[0x1c] = L'\0';
  shift_keys[0x1d] = L'\0';
  shift_keys[0x1e] = L'\0';
  shift_keys[0x1f] = L'\0';
  shift_keys[0x18] = L'\0';
  shift_keys[0x19] = L'\0';
  shift_keys[0x1a] = L'\0';
  shift_keys[0x1b] = L'\0';
  shift_keys[0x14] = L'\0';
  shift_keys[0x15] = L'\0';
  shift_keys[0x16] = L'\0';
  shift_keys[0x17] = L'\0';
  shift_keys[0x10] = L'\0';
  shift_keys[0x11] = L'\0';
  shift_keys[0x12] = L'\0';
  shift_keys[0x13] = L'\0';
  shift_keys[0xc] = L'\0';
  shift_keys[0xd] = L'\0';
  shift_keys[0xe] = L'\0';
  shift_keys[0xf] = L'\0';
  shift_keys[8] = L'\0';
  shift_keys[9] = L'\0';
  shift_keys[10] = L'\0';
  shift_keys[0xb] = L'\0';
  shift_keys[4] = L'\0';
  shift_keys[5] = L'\0';
  shift_keys[6] = L'\0';
  shift_keys[7] = L'\0';
  shift_keys[0] = L'\0';
  shift_keys[1] = L'\0';
  shift_keys[2] = L'\0';
  shift_keys[3] = L'\0';
  shift_keys[0x30] = L'\0';
  altgr_keys[0x2c] = L'\0';
  altgr_keys[0x2d] = L'\0';
  altgr_keys[0x2e] = L'\0';
  altgr_keys[0x2f] = L'\0';
  altgr_keys[0x28] = L'\0';
  altgr_keys[0x29] = L'\0';
  altgr_keys[0x2a] = L'\0';
  altgr_keys[0x2b] = L'\0';
  altgr_keys[0x24] = L'\0';
  altgr_keys[0x25] = L'\0';
  altgr_keys[0x26] = L'\0';
  altgr_keys[0x27] = L'\0';
  altgr_keys[0x20] = L'\0';
  altgr_keys[0x21] = L'\0';
  altgr_keys[0x22] = L'\0';
  altgr_keys[0x23] = L'\0';
  altgr_keys[0x1c] = L'\0';
  altgr_keys[0x1d] = L'\0';
  altgr_keys[0x1e] = L'\0';
  altgr_keys[0x1f] = L'\0';
  altgr_keys[0x18] = L'\0';
  altgr_keys[0x19] = L'\0';
  altgr_keys[0x1a] = L'\0';
  altgr_keys[0x1b] = L'\0';
  altgr_keys[0x14] = L'\0';
  altgr_keys[0x15] = L'\0';
  altgr_keys[0x16] = L'\0';
  altgr_keys[0x17] = L'\0';
  altgr_keys[0x10] = L'\0';
  altgr_keys[0x11] = L'\0';
  altgr_keys[0x12] = L'\0';
  altgr_keys[0x13] = L'\0';
  altgr_keys[0xc] = L'\0';
  altgr_keys[0xd] = L'\0';
  altgr_keys[0xe] = L'\0';
  altgr_keys[0xf] = L'\0';
  altgr_keys[8] = L'\0';
  altgr_keys[9] = L'\0';
  altgr_keys[10] = L'\0';
  altgr_keys[0xb] = L'\0';
  altgr_keys[4] = L'\0';
  altgr_keys[5] = L'\0';
  altgr_keys[6] = L'\0';
  altgr_keys[7] = L'\0';
  altgr_keys[0] = L'\0';
  altgr_keys[1] = L'\0';
  altgr_keys[2] = L'\0';
  altgr_keys[3] = L'\0';
  altgr_keys[0x30] = L'\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&local_190);
  execute_abi_cxx11_((char *)local_338);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_318,local_338,_Var2);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::string((string *)&index);
  utf8code = 0;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_318,(string *)&index);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::ios::clear((long)&local_190 + *(long *)(local_190 + -0x18),0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"",&local_399);
    std::__cxx11::stringstream::str((string *)&local_190);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    local_374 = L'\0';
    local_370 = std::__cxx11::string::find((char *)&index,0x10d7d0);
    while (local_370 != -1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&index);
      *puVar4 = 0x30;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&index);
      *puVar4 = 0x78;
      local_370 = std::__cxx11::string::find((char *)&index,0x10d7d0);
    }
    utf8code = utf8code + 1;
    if (0x80 < (uint)utf8code) break;
    bVar1 = is_char_key(utf8code);
    if (bVar1) {
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 0) {
        __assert_fail("line.size() > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/regular-dev[P]MousKee/src/main.cpp"
                      ,0xbb,"void determine_system_keymap()");
      }
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
      if (*pcVar6 == 'k') {
        local_370 = to_char_keys_index(utf8code);
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        std::operator<<(local_180,pcVar6);
        piVar3 = (istream *)std::istream::operator>>((istream *)&local_190,std::hex);
        std::istream::operator>>(piVar3,&local_374);
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        if ((*pcVar6 == '+') && ((local_374 & 0xb00U) != 0)) {
          local_374 = local_374 ^ 0xb00;
        }
        char_keys[local_370] = local_374;
        piVar3 = (istream *)std::istream::operator>>((istream *)&local_190,std::hex);
        plVar7 = (long *)std::istream::operator>>(piVar3,&local_374);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
        if (bVar1) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
          if ((*pcVar6 == '+') && ((local_374 & 0xb00U) != 0)) {
            local_374 = local_374 ^ 0xb00;
          }
          shift_keys[local_370] = local_374;
        }
        piVar3 = (istream *)std::istream::operator>>((istream *)&local_190,std::hex);
        plVar7 = (long *)std::istream::operator>>(piVar3,&local_374);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
        if (bVar1) {
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
          if ((*pcVar6 == '+') && ((local_374 & 0xb00U) != 0)) {
            local_374 = local_374 ^ 0xb00;
          }
          altgr_keys[local_370] = local_374;
        }
      }
      else {
        utf8code = utf8code - 1;
        local_370 = to_char_keys_index(utf8code);
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        std::operator<<(local_180,pcVar6);
        piVar3 = (istream *)std::istream::operator>>((istream *)&local_190,std::hex);
        std::istream::operator>>(piVar3,&local_374);
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        if ((*pcVar6 == '+') && ((local_374 & 0xb00U) != 0)) {
          local_374 = local_374 ^ 0xb00;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        if (*pcVar6 == 's') {
          shift_keys[local_370] = local_374;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&index);
        if (*pcVar6 == 'a') {
          altgr_keys[local_370] = local_374;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::stringstream::~stringstream(local_318);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_190);
  return;
}

Assistant:

void determine_system_keymap()
{
    // custom map will be used; erase existing US keymapping
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    // get keymap from dumpkeys
    // if one knows of a better, more portable way to get wchar_t-s from symbolic keysym-s from `dumpkeys` or `xmodmap` or another, PLEASE LET ME KNOW! kthx
    std::stringstream ss, dump(execute(COMMAND_STR_DUMPKEYS));             // see example output after i.e. `loadkeys slovene`
    std::string line;

    unsigned int i = 0;             // keycode
    int index;
    int utf8code;             // utf-8 code of keysym answering keycode i

    while (std::getline(dump, line)) {
        ss.clear();
        ss.str("");
        utf8code = 0;

        // replace any U+#### with 0x#### for easier parsing
        index = line.find("U+", 0);
        while (static_cast<std::string::size_type>(index) != std::string::npos) {
            line[index] = '0'; line[index + 1] = 'x';
            index = line.find("U+", index);
        }

        if (++i >= sizeof(char_or_func)) break;                         // only ever map keycodes up to 128 (currently N_KEYS_DEFINED are used)
        if (!is_char_key(i)) continue;                         // only map character keys of keyboard

        assert(line.size() > 0);
        if (line[0] == 'k') {                         // if line starts with 'keycode'
            index = to_char_keys_index(i);

            ss << &line[14];                                     // 1st keysym starts at index 14 (skip "keycode XXX = ")
            ss >> std::hex >> utf8code;
            // 0XB00CLUELESS: 0xB00 is added to some keysyms that are preceeded with '+'; I don't really know why; see `man keymaps`; `man loadkeys` says numeric keysym values aren't to be relied on, orly?
            if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
            char_keys[index] = static_cast<wchar_t>(utf8code);

            // if there is a second keysym column, assume it is a shift column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                shift_keys[index] = static_cast<wchar_t>(utf8code);
            }

            // if there is a third keysym column, assume it is an altgr column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                altgr_keys[index] = static_cast<wchar_t>(utf8code);
            }

            continue;
        }

        // else if line starts with 'shift i'
        index = to_char_keys_index(--i);
        ss << &line[21];                         // 1st keysym starts at index 21 (skip "\tshift\tkeycode XXX = " or "\taltgr\tkeycode XXX = ")
        ss >> std::hex >> utf8code;
        if (line[21] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;                         // see line 0XB00CLUELESS

        if (line[1] == 's')                         // if line starts with "shift"
            shift_keys[index] = static_cast<wchar_t>(utf8code);
        if (line[1] == 'a')                         // if line starts with "altgr"
            altgr_keys[index] = static_cast<wchar_t>(utf8code);
    }             // while (getline(dump, line))
}